

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::DebugCheckVersionAndDataLayout
               (char *version,size_t sz_io,size_t sz_style,size_t sz_vec2,size_t sz_vec4,
               size_t sz_vert,size_t sz_idx)

{
  int iVar1;
  
  iVar1 = strcmp(version,"1.84 WIP");
  if (iVar1 != 0) {
    __assert_fail("strcmp(version, \"1.84 WIP\") == 0 && \"Mismatched version string!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bd9,
                  "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                 );
  }
  if (sz_io != 0x1558) {
    __assert_fail("sz_io == sizeof(ImGuiIO) && \"Mismatched struct layout!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bda,
                  "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                 );
  }
  if (sz_style != 0x414) {
    __assert_fail("sz_style == sizeof(ImGuiStyle) && \"Mismatched struct layout!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bdb,
                  "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                 );
  }
  if (sz_vec2 == 8) {
    if (sz_vec4 != 0x10) {
      __assert_fail("sz_vec4 == sizeof(ImVec4) && \"Mismatched struct layout!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x1bdd,
                    "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                   );
    }
    if (sz_vert == 0x14) {
      if (sz_idx == 2) {
        return true;
      }
      __assert_fail("sz_idx == sizeof(ImDrawIdx) && \"Mismatched struct layout!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x1bdf,
                    "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                   );
    }
    __assert_fail("sz_vert == sizeof(ImDrawVert) && \"Mismatched struct layout!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bde,
                  "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                 );
  }
  __assert_fail("sz_vec2 == sizeof(ImVec2) && \"Mismatched struct layout!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0x1bdc,
                "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
               );
}

Assistant:

bool ImGui::DebugCheckVersionAndDataLayout(const char* version, size_t sz_io, size_t sz_style, size_t sz_vec2, size_t sz_vec4, size_t sz_vert, size_t sz_idx)
{
    bool error = false;
    if (strcmp(version, IMGUI_VERSION) != 0) { error = true; IM_ASSERT(strcmp(version, IMGUI_VERSION) == 0 && "Mismatched version string!"); }
    if (sz_io != sizeof(ImGuiIO)) { error = true; IM_ASSERT(sz_io == sizeof(ImGuiIO) && "Mismatched struct layout!"); }
    if (sz_style != sizeof(ImGuiStyle)) { error = true; IM_ASSERT(sz_style == sizeof(ImGuiStyle) && "Mismatched struct layout!"); }
    if (sz_vec2 != sizeof(ImVec2)) { error = true; IM_ASSERT(sz_vec2 == sizeof(ImVec2) && "Mismatched struct layout!"); }
    if (sz_vec4 != sizeof(ImVec4)) { error = true; IM_ASSERT(sz_vec4 == sizeof(ImVec4) && "Mismatched struct layout!"); }
    if (sz_vert != sizeof(ImDrawVert)) { error = true; IM_ASSERT(sz_vert == sizeof(ImDrawVert) && "Mismatched struct layout!"); }
    if (sz_idx != sizeof(ImDrawIdx)) { error = true; IM_ASSERT(sz_idx == sizeof(ImDrawIdx) && "Mismatched struct layout!"); }
    return !error;
}